

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.cc
# Opt level: O3

bool __thiscall
draco::GeometryAttribute::CopyFrom(GeometryAttribute *this,GeometryAttribute *src_att)

{
  DataBuffer *pDVar1;
  pointer data;
  int64_t iVar2;
  
  this->num_components_ = src_att->num_components_;
  this->data_type_ = src_att->data_type_;
  this->normalized_ = src_att->normalized_;
  iVar2 = src_att->byte_offset_;
  this->byte_stride_ = src_att->byte_stride_;
  this->byte_offset_ = iVar2;
  this->attribute_type_ = src_att->attribute_type_;
  iVar2 = (src_att->buffer_descriptor_).buffer_update_count;
  (this->buffer_descriptor_).buffer_id = (src_att->buffer_descriptor_).buffer_id;
  (this->buffer_descriptor_).buffer_update_count = iVar2;
  this->unique_id_ = src_att->unique_id_;
  pDVar1 = src_att->buffer_;
  if (pDVar1 == (DataBuffer *)0x0) {
    this->buffer_ = (DataBuffer *)0x0;
    return true;
  }
  if (this->buffer_ != (DataBuffer *)0x0) {
    data = (pDVar1->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
    DataBuffer::Update(this->buffer_,data,
                       (long)(pDVar1->data_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)data);
    return true;
  }
  return false;
}

Assistant:

bool GeometryAttribute::CopyFrom(const GeometryAttribute &src_att) {
  num_components_ = src_att.num_components_;
  data_type_ = src_att.data_type_;
  normalized_ = src_att.normalized_;
  byte_stride_ = src_att.byte_stride_;
  byte_offset_ = src_att.byte_offset_;
  attribute_type_ = src_att.attribute_type_;
  buffer_descriptor_ = src_att.buffer_descriptor_;
  unique_id_ = src_att.unique_id_;
  if (src_att.buffer_ == nullptr) {
    buffer_ = nullptr;
  } else {
    if (buffer_ == nullptr) {
      return false;
    }
    buffer_->Update(src_att.buffer_->data(), src_att.buffer_->data_size());
  }
#ifdef DRACO_TRANSCODER_SUPPORTED
  name_ = src_att.name_;
#endif
  return true;
}